

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::Path(Path *this,Path *path)

{
  Path *path_local;
  Path *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)path);
  return;
}

Assistant:

Path::Path(const Path& path)
{
  m_path = path.m_path;
}